

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O3

float Lf_CutRef_rec(Lf_Man_t *p,Lf_Cut_t *pCut)

{
  uint uVar1;
  Jf_Par_t *pJVar2;
  int *piVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  word CutTemp [10];
  Lf_Cut_t local_78;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_78.iFunc = 0;
  local_78._20_4_ = 0;
  uStack_60 = 0;
  local_78.Sign = 0;
  local_78.Delay = 0;
  local_78.Flow = 0.0;
  uVar1 = *(uint *)&pCut->field_0x14;
  fVar8 = 0.0;
  if ((uVar1 >> 0x17 & 1) == 0 && 0x1ffffff < uVar1) {
    uVar4 = uVar1 >> 0x18;
    pJVar2 = p->pPars;
    if (pJVar2->fPower == 0) {
      if (pJVar2->fOptEdge == 0) {
        if (pJVar2->fCutGroup == 0) {
          fVar8 = 1.0;
        }
        else {
          fVar8 = (float)(byte)((pJVar2->nLutSize / 2 < (int)uVar4) + 1);
        }
      }
      else {
        if (pJVar2->fCutGroup == 0) {
          iVar6 = 1;
        }
        else {
          iVar6 = (pJVar2->nLutSize / 2 < (int)uVar4) + 1;
        }
        fVar8 = (float)(int)(iVar6 * (pJVar2->nAreaTuner + uVar4));
      }
      goto LAB_00764d59;
    }
    fVar8 = 0.0;
    uVar7 = 0;
    do {
      iVar6 = *(int *)((long)&pCut[1].Sign + uVar7 * 4);
      if (((long)iVar6 < 0) || ((p->vSwitches).nSize <= iVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                      ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
      }
      fVar8 = fVar8 + (p->vSwitches).pArray[iVar6];
      uVar7 = uVar7 + 1;
    } while (uVar4 != uVar7);
    fVar8 = (float)uVar4 + fVar8;
  }
  if (uVar1 < 0x1000000) {
    return fVar8;
  }
LAB_00764d59:
  uVar7 = 0;
  do {
    uVar1 = *(uint *)((long)&pCut[1].Sign + uVar7 * 4);
    if ((ulong)uVar1 == 0) {
      return fVar8;
    }
    if (((int)uVar1 < 0) || ((p->vOffsets).nSize <= (int)uVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar6 = (p->vOffsets).pArray[uVar1];
    lVar5 = (long)iVar6;
    if (-1 < lVar5) {
      if ((p->vMapRefs).nSize <= iVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar3 = (p->vMapRefs).pArray;
      iVar6 = piVar3[lVar5];
      piVar3[lVar5] = iVar6 + 1;
      if (iVar6 == 0) {
        Lf_ObjCutBestNew(p,uVar1,&local_78);
        fVar9 = Lf_CutRef_rec(p,&local_78);
        fVar8 = fVar8 + fVar9;
      }
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 < (byte)pCut->field_0x17);
  return fVar8;
}

Assistant:

float Lf_CutRef_rec( Lf_Man_t * p, Lf_Cut_t * pCut )
{
    word CutTemp[LF_CUT_WORDS] = {0};
    float Count = Lf_CutArea(p, pCut);
    int i, Var; 
    Lf_CutForEachVar( pCut, Var, i )
        if ( !Lf_ObjMapRefInc(p, Var) )
            Count += Lf_CutRef_rec( p, Lf_ObjCutBestNew(p, Var, (Lf_Cut_t *)CutTemp) );
    return Count;
}